

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_read_deviate_unique(lys_deviate *deviate,lys_node *dev_target)

{
  ly_ctx *ctx;
  lys_ext_instance **pplVar1;
  int iVar2;
  
  ctx = dev_target->module->ctx;
  if (dev_target->nodetype == LYS_LIST) {
    iVar2 = 0;
    if (deviate->mod == LY_DEVIATE_ADD) {
      pplVar1 = (lys_ext_instance **)
                ly_realloc(dev_target[1].ext,
                           (ulong)(((uint)dev_target->padding[3] + (uint)deviate->unique_size) *
                                  0x10));
      if (pplVar1 == (lys_ext_instance **)0x0) {
        iVar2 = 1;
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_read_deviate_unique");
      }
      else {
        dev_target[1].ext = pplVar1;
        iVar2 = 0;
        memset(pplVar1 + (ulong)dev_target->padding[3] * 2,0,(ulong)deviate->unique_size << 4);
      }
    }
  }
  else {
    ly_vlog(ctx,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"unique");
    ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Target node does not allow \"unique\" property.")
    ;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
yang_read_deviate_unique(struct lys_deviate *deviate, struct lys_node *dev_target)
{
    struct ly_ctx *ctx = dev_target->module->ctx;
    struct lys_node_list *list;
    struct lys_unique *unique;

    /* check target node type */
    if (dev_target->nodetype != LYS_LIST) {
        LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, "unique");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"unique\" property.");
        goto error;
    }

    list = (struct lys_node_list *)dev_target;
    if (deviate->mod == LY_DEVIATE_ADD) {
        /* reallocate the unique array of the target */
        unique = ly_realloc(list->unique, (deviate->unique_size + list->unique_size) * sizeof *unique);
        LY_CHECK_ERR_GOTO(!unique, LOGMEM(ctx), error);
        list->unique = unique;
        memset(unique + list->unique_size, 0, deviate->unique_size * sizeof *unique);
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}